

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineMultipleRead.cpp
# Opt level: O3

void testDeepScanLineMultipleRead(string *tempDir)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  undefined4 *puVar9;
  int *piVar10;
  long lVar11;
  ostream *poVar12;
  pointer puVar13;
  float *pfVar14;
  int range;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  uint sample_count;
  float *sample_ptr;
  _Base_ptr p_Stack_180;
  _Base_ptr local_178;
  DeepScanLineOutputFile file;
  _Base_ptr local_158;
  float sample;
  string source_filename;
  vector<unsigned_int,_std::allocator<unsigned_int>_> samplecounts;
  Header header;
  DeepFrameBuffer fb;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\nTesting random re-reads from deep scanline file:\n",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  source_filename._M_dataplus._M_p = (pointer)&source_filename.field_2;
  pcVar4 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&source_filename,pcVar4,pcVar4 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&source_filename);
  random_reseed(1);
  _Var5 = source_filename._M_dataplus;
  fb._map._M_t._M_impl._0_8_ = 0;
  Imf_3_2::Header::Header(&header,4,0x30,1.0,(Vec2 *)&fb,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar8 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&fb,FLOAT,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar8,(Channel *)0x1ca889);
  puVar9 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar9 = 2;
  Imf_3_2::Header::setType((string *)&header);
  remove(_Var5._M_p);
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile(&file,_Var5._M_p,&header,iVar6);
  sample_ptr = &sample;
  p_Var1 = &fb._map._M_t._M_impl.super__Rb_tree_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_3_2::Slice::Slice(&fb._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_2::Slice::Slice((Slice *)&samplecounts,UINT,(char *)&sample_count,0,0,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&fb);
  Imf_3_2::DeepSlice::DeepSlice
            ((DeepSlice *)&samplecounts,FLOAT,(char *)&sample_ptr,0,0,0,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insert((char *)&fb,(DeepSlice *)0x1ca889);
  Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  uVar15 = 0;
  do {
    sample = (float)(int)(uVar15 + 100);
    sample_count = uVar15;
    Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x30);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&fb);
  Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
  Imf_3_2::Header::~Header(&header);
  _Var5 = source_filename._M_dataplus;
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
            ((DeepScanLineInputFile *)&sample_count,_Var5._M_p,iVar6);
  Imf_3_2::DeepScanLineInputFile::header();
  piVar10 = (int *)Imf_3_2::Header::dataWindow();
  iVar6 = *piVar10;
  iVar2 = piVar10[1];
  iVar7 = piVar10[2];
  iVar3 = piVar10[3];
  iVar16 = 0;
  if (iVar2 <= iVar3 && iVar6 <= iVar7) {
    iVar16 = iVar7 - iVar6;
  }
  range = 1;
  if (iVar2 <= iVar3 && iVar6 <= iVar7) {
    range = (iVar3 - iVar2) + 1;
  }
  Imf_3_2::DeepScanLineInputFile::header();
  Imf_3_2::Header::channels();
  lVar11 = Imf_3_2::ChannelList::begin();
  uVar15 = iVar16 + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&samplecounts,(long)(int)uVar15,(allocator_type *)&fb);
  std::vector<float_*,_std::allocator<float_*>_>::vector
            ((vector<float_*,_std::allocator<float_*>_> *)&file,(long)(int)uVar15,
             (allocator_type *)&fb);
  local_178 = (_Base_ptr)0x0;
  sample_ptr = (float *)0x0;
  p_Stack_180 = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_3_2::Slice::Slice(&fb._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_2::Slice::Slice
            ((Slice *)&header,UINT,
             (char *)(samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start + -(long)iVar6),4,0,1,1,0.0,false,
             false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&fb);
  Imf_3_2::DeepSlice::DeepSlice
            ((DeepSlice *)&header,FLOAT,(char *)((long)iVar6 * -8 + (long)_file),8,0,4,1,1,0.0,false
             ,false);
  Imf_3_2::DeepFrameBuffer::insert((char *)&fb,(DeepSlice *)(lVar11 + 0x20));
  Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&sample_count);
  iVar6 = 0;
  do {
    iVar7 = random_int(range);
    uVar18 = iVar7 + iVar2;
    Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&sample_count,uVar18);
    if (iVar16 < 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = uVar18 * uVar15;
      uVar17 = 0;
      puVar13 = samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start;
      do {
        if (puVar13[uVar17] != uVar18) {
          poVar12 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12," error, sample counts should be ",0x20);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,", is ",5);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          std::ostream::flush();
          puVar13 = samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17] != uVar18) {
            __assert_fail("samplecounts[i] == static_cast<unsigned int> (row)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineMultipleRead.cpp"
                          ,0x9b,"void (anonymous namespace)::read_file(const char *)");
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar15 != uVar17);
    }
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&sample_ptr,(long)(int)uVar19);
    if ((-1 < iVar16) && (0 < (int)uVar19)) {
      lVar11 = 0;
      iVar7 = 0;
      do {
        *(float **)((long)_file + lVar11 * 8) = sample_ptr + iVar7;
        if (iVar16 <= lVar11) break;
        iVar7 = iVar7 + samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar11];
        lVar11 = lVar11 + 1;
      } while (iVar7 < (int)uVar19);
    }
    Imf_3_2::DeepScanLineInputFile::readPixels((int)&sample_count,uVar18);
    if (0 < (int)uVar19) {
      fVar20 = (float)(int)uVar18 + 100.0;
      uVar17 = 0;
      pfVar14 = sample_ptr;
      do {
        fVar21 = pfVar14[uVar17];
        if ((fVar21 != fVar20) || (NAN(fVar21) || NAN(fVar20))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," sample ",8);
          poVar12 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," on row ",8);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," error, shuold be ",0x12);
          poVar12 = std::ostream::_M_insert<double>((double)fVar20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," got ",5);
          poVar12 = std::ostream::_M_insert<double>((double)sample_ptr[uVar17]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          std::ostream::flush();
          fVar21 = sample_ptr[uVar17];
          pfVar14 = sample_ptr;
        }
        if ((fVar21 != fVar20) || (NAN(fVar21) || NAN(fVar20))) {
          __assert_fail("samples[i] == row + 100.f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineMultipleRead.cpp"
                        ,0xbe,"void (anonymous namespace)::read_file(const char *)");
        }
        uVar17 = uVar17 + 1;
      } while (uVar19 != uVar17);
    }
    iVar6 = iVar6 + 1;
    if (iVar6 == 4000) {
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&fb);
      if (sample_ptr != (float *)0x0) {
        operator_delete(sample_ptr,(long)local_178 - (long)sample_ptr);
      }
      if (_file != (void *)0x0) {
        operator_delete(_file,(long)local_158 - (long)_file);
      }
      if (samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)samplecounts.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)samplecounts.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)&sample_count)
      ;
      remove(source_filename._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ok\n",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)source_filename._M_dataplus._M_p != &source_filename.field_2) {
        operator_delete(source_filename._M_dataplus._M_p,
                        source_filename.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
testDeepScanLineMultipleRead (const std::string& tempDir)
{

    cout << "\n\nTesting random re-reads from deep scanline file:\n" << endl;

    std::string source_filename = tempDir + "imf_test_multiple_read";
    random_reseed (1);

    make_file (source_filename.c_str ());
    read_file (source_filename.c_str ());
    remove (source_filename.c_str ());

    cout << " ok\n" << endl;
}